

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ym2612.c
# Opt level: O0

void YM2612_DacAndTimers_Update(ym2612_ *YM2612,DEV_SMPL **buffer,UINT32 length)

{
  DEV_SMPL *pDVar1;
  DEV_SMPL *pDVar2;
  int iVar3;
  int iVar4;
  uint local_38;
  uint local_34;
  int dac;
  UINT32 i;
  DEV_SMPL *bufR;
  DEV_SMPL *bufL;
  UINT32 length_local;
  DEV_SMPL **buffer_local;
  ym2612_ *YM2612_local;
  
  if (((YM2612->DAC != '\0') && (YM2612->DACdata != 0)) && (YM2612->DAC_Mute == '\0')) {
    pDVar1 = *buffer;
    pDVar2 = buffer[1];
    for (local_34 = 0; local_34 < length; local_34 = local_34 + 1) {
      local_38 = YM2612->DACdata;
      if (YM2612->DAC_Highpass_Enable != '\0') {
        iVar3 = local_38 * 0x8000 - YM2612->dac_highpass;
        YM2612->dac_highpass = (iVar3 >> 9) + YM2612->dac_highpass;
        local_38 = iVar3 >> 0xf;
      }
      pDVar1[local_34] = (local_38 & YM2612->CHANNEL[5].LEFT) + pDVar1[local_34];
      pDVar2[local_34] = (local_38 & YM2612->CHANNEL[5].RIGHT) + pDVar2[local_34];
    }
  }
  iVar3 = YM2612->TimerBase * length;
  if (((YM2612->Mode & 1) != 0) &&
     (iVar4 = YM2612->TimerAcnt - iVar3, YM2612->TimerAcnt = iVar4, iVar4 < 1)) {
    YM2612->Status = (int)(YM2612->Mode & 4) >> 2 | YM2612->Status;
    YM2612->TimerAcnt = YM2612->TimerAL + YM2612->TimerAcnt;
    if ((YM2612->Mode & 0x80) != 0) {
      CSM_Key_Control(YM2612);
    }
  }
  if (((YM2612->Mode & 2) != 0) &&
     (iVar3 = YM2612->TimerBcnt - iVar3, YM2612->TimerBcnt = iVar3, iVar3 < 1)) {
    YM2612->Status = (int)(YM2612->Mode & 8) >> 2 | YM2612->Status;
    YM2612->TimerBcnt = YM2612->TimerBL + YM2612->TimerBcnt;
  }
  return;
}

Assistant:

void YM2612_DacAndTimers_Update(ym2612_ *YM2612, DEV_SMPL **buffer, UINT32 length)
{
  DEV_SMPL *bufL, *bufR;
  UINT32 i;

  if (YM2612->DAC && YM2612->DACdata && ! YM2612->DAC_Mute)
  {
    bufL = buffer[0];
    bufR = buffer[1];

    for (i = 0; i < length; i++)
    {
      int dac = YM2612->DACdata;
      if (YM2612->DAC_Highpass_Enable)
      {
        dac = (dac << highpass_fract) - YM2612->dac_highpass;
        YM2612->dac_highpass += dac >> highpass_shift;
        dac >>= highpass_fract;
      }
      bufL[i] += (dac & YM2612->CHANNEL[5].LEFT);
      bufR[i] += (dac & YM2612->CHANNEL[5].RIGHT);
    }
  }

  i = YM2612->TimerBase * length;

  if (YM2612->Mode & 1)             // Timer A ON ?
  {
//    if ((YM2612->TimerAcnt -= 14073) <= 0)   // 13879=NTSC (old: 14475=NTSC  14586=PAL)
    if ((YM2612->TimerAcnt -= i) <= 0)
    {
      YM2612->Status |= (YM2612->Mode & 0x04) >> 2;
      YM2612->TimerAcnt += YM2612->TimerAL;

#if YM_DEBUG_LEVEL > 0
      fprintf(debug_file, "Counter A overflow\n");
#endif

      if (YM2612->Mode & 0x80)
        CSM_Key_Control(YM2612);
    }
  }

  if (YM2612->Mode & 2)             // Timer B ON ?
  {
//    if ((YM2612->TimerBcnt -= 14073) <= 0)   // 13879=NTSC (old: 14475=NTSC  14586=PAL)
    if ((YM2612->TimerBcnt -= i) <= 0)
    {
      YM2612->Status |= (YM2612->Mode & 0x08) >> 2;
      YM2612->TimerBcnt += YM2612->TimerBL;

#if YM_DEBUG_LEVEL > 0
      fprintf(debug_file, "Counter B overflow\n");
#endif
    }
  }
}